

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O2

bool __thiscall V2MPlayer::Open(V2MPlayer *this,void *a_v2mptr,uint32_t a_samplerate)

{
  bool bVar1;
  
  if ((this->m_base).valid == true) {
    if ((this->m_state).state != OFF) {
      (this->m_state).state = OFF;
    }
    (this->m_base).valid = false;
  }
  this->m_samplerate = a_samplerate;
  bVar1 = InitBase(this,a_v2mptr);
  if (bVar1) {
    Reset(this);
    (this->m_base).valid = true;
  }
  return bVar1;
}

Assistant:

bool V2MPlayer::Open(const void *a_v2mptr, uint32_t a_samplerate)
{
    if (m_base.valid)
        Close();

    m_samplerate = a_samplerate;

    if (!InitBase(a_v2mptr))
        return sFALSE;

    Reset();
    return m_base.valid = sTRUE;
}